

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O0

uint hbd_obmc_sad_w8n_avx2
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar7 [16];
  __m128i v_d;
  __m128i v_sad_d_1;
  __m128i v_sad_d_0;
  __m256i v_rad0_d;
  __m256i v_tmp_d;
  __m256i v_absdiff0_d;
  __m256i v_diff0_d;
  __m256i v_pm0_d;
  __m256i v_p0_d;
  __m256i v_w0_d;
  __m256i v_m0_d;
  __m128i v_p0_w;
  __m256i v_bias_d;
  __m256i v_sad_d;
  int n;
  int pre_step;
  uint16_t *pre;
  undefined1 local_2e0 [32];
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_2b0 = in_RDI * 2;
  local_2b8 = 0;
  local_2e0 = ZEXT1632(ZEXT816(0));
  auVar3 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar3 = vpinsrd_avx(auVar3,0x800,2);
  auVar3 = vpinsrd_avx(auVar3,0x800,3);
  auVar4 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar4 = vpinsrd_avx(auVar4,0x800,2);
  auVar4 = vpinsrd_avx(auVar4,0x800,3);
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  uStack_90 = auVar7._0_8_;
  uStack_88 = auVar7._8_8_;
  do {
    auVar7 = vlddqu_avx(*(undefined1 (*) [16])(local_2b0 + (long)local_2b8 * 2));
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])(in_RCX + (long)local_2b8 * 4));
    auVar2 = vlddqu_avx(*(undefined1 (*) [32])(in_RDX + (long)local_2b8 * 4));
    auVar5 = vpmovzxwd_avx2(auVar7);
    auVar1 = vpmaddwd_avx2(auVar5,auVar1);
    auVar1 = vpsubd_avx2(auVar2,auVar1);
    auVar1 = vpabsd_avx2(auVar1);
    auVar2._16_8_ = uStack_90;
    auVar2._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    auVar2._24_8_ = uStack_88;
    auVar1 = vpaddd_avx2(auVar1,auVar2);
    auVar1 = vpsrld_avx2(auVar1,ZEXT416(0xc));
    local_2e0 = vpaddd_avx2(local_2e0,auVar1);
    local_2b8 = local_2b8 + 8;
    if (local_2b8 % in_R8D == 0) {
      local_2b0 = local_2b0 + (long)(in_ESI - in_R8D) * 2;
    }
  } while (local_2b8 < in_R8D * in_R9D);
  vpaddd_avx(local_2e0._0_16_,local_2e0._16_16_);
  v_d[1]._0_4_ = 0x800;
  v_d[0] = 0x800;
  v_d[1]._4_4_ = 0;
  uVar6 = xx_hsum_epi32_si32(v_d);
  return uVar6;
}

Assistant:

static inline unsigned int hbd_obmc_sad_w8n_avx2(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, const int width, const int height) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - width;
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);

  assert(width >= 8);
  assert(IS_POWER_OF_TWO(width));

  do {
    const __m128i v_p0_w = _mm_lddqu_si128((__m128i *)(pre + n));
    const __m256i v_m0_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w0_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p0_d = _mm256_cvtepu16_epi32(v_p0_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm0_d = _mm256_madd_epi16(v_p0_d, v_m0_d);

    const __m256i v_diff0_d = _mm256_sub_epi32(v_w0_d, v_pm0_d);
    const __m256i v_absdiff0_d = _mm256_abs_epi32(v_diff0_d);

    // Rounded absolute difference
    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff0_d, v_bias_d);
    const __m256i v_rad0_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad0_d);

    n += 8;

    if (n % width == 0) pre += pre_step;
  } while (n < width * height);

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}